

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * getTypedProperty<std::__cxx11::string>
                   (string *__return_storage_ptr__,cmGeneratorTarget *tgt,string *prop,
                   cmGeneratorExpressionInterpreter *genexInterpreter)

{
  pointer pcVar1;
  char *expression;
  string *psVar2;
  size_t sVar3;
  char *__s;
  
  expression = cmGeneratorTarget::GetProperty(tgt,prop);
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    __s = "(unset)";
    if (expression != (char *)0x0) {
      __s = expression;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar3);
  }
  else {
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,expression,prop);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypedProperty<std::string>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  const char* value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return valueAsString(value);
  }

  return genexInterpreter->Evaluate(value, prop);
}